

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlUnnormalize(Ssw_Sml_t *p)

{
  int iVar1;
  uint *puVar2;
  Aig_Obj_t *pObj_00;
  int local_28;
  int local_24;
  int k;
  int i;
  uint *pSims;
  Aig_Obj_t *pObj;
  Ssw_Sml_t *p_local;
  
  puVar2 = Ssw_ObjSim(p,0);
  for (local_24 = 0; local_24 < p->nWordsFrame; local_24 = local_24 + 1) {
    puVar2[local_24] = puVar2[local_24] ^ 0xffffffff;
  }
  for (local_28 = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), local_28 < iVar1; local_28 = local_28 + 1)
  {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,local_28);
    if (((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) &&
       ((*(ulong *)&pObj_00->field_0x18 >> 3 & 1) != 0)) {
      puVar2 = Ssw_ObjSim(p,pObj_00->Id);
      for (local_24 = 0; local_24 < p->nWordsFrame; local_24 = local_24 + 1) {
        puVar2[local_24] = puVar2[local_24] ^ 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

void Ssw_SmlUnnormalize( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int i, k;
    // convert constant 1
    pSims  = Ssw_ObjSim( p, 0 );
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims[i] = ~pSims[i];
    // convert internal nodes
    Aig_ManForEachNode( p->pAig, pObj, k )
    {
        if ( pObj->fPhase == 0 )
            continue;
        pSims  = Ssw_ObjSim( p, pObj->Id );
        for ( i = 0; i < p->nWordsFrame; i++ )
            pSims[i] = ~pSims[i];
    }
    // PIs/POs are always stored in their natural state
}